

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O3

void DrawRectangleInWindow(WINDOW *win,int x,int y,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = wmove(win,y,x);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010a238);
  }
  iVar1 = wmove(win,y);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010a234);
  }
  iVar3 = y + height;
  iVar1 = wmove(win,iVar3,x);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010a23c);
  }
  iVar1 = wmove(win,iVar3,width + x);
  if (iVar1 != -1) {
    waddch(win,_DAT_0010a230);
  }
  if (1 < height) {
    iVar4 = height + -1;
    iVar1 = y;
    do {
      iVar1 = iVar1 + 1;
      iVar2 = wmove(win,iVar1,x);
      if (iVar2 != -1) {
        waddch(win,_DAT_0010a268);
      }
      iVar2 = wmove(win,iVar1,width + x);
      if (iVar2 != -1) {
        waddch(win,_DAT_0010a268);
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (1 < width) {
    iVar1 = width + -1;
    iVar4 = x + 1;
    do {
      iVar2 = wmove(win,y,iVar4);
      if (iVar2 != -1) {
        waddch(win,_DAT_0010a24c);
      }
      iVar2 = wmove(win,iVar3,iVar4);
      if (iVar2 != -1) {
        waddch(win,_DAT_0010a24c);
      }
      iVar4 = iVar4 + 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

static void DrawRectangleInWindow(WINDOW* win,
                                  int x,
                                  int y,
                                  int width,
                                  int height)
{
  mvwaddch(win, y, x, ACS_ULCORNER);
  mvwaddch(win, y, x + width, ACS_URCORNER);
  mvwaddch(win, y + height, x, ACS_LLCORNER);
  mvwaddch(win, y + height, x + width, ACS_LRCORNER);

  for (int i = 1; i < height; i++) {
    mvwaddch(win, y + i, x, ACS_VLINE);
    mvwaddch(win, y + i, x + width, ACS_VLINE);
  }

  for (int i = 1; i < width; i++) {
    mvwaddch(win, y, x + i, ACS_HLINE);
    mvwaddch(win, y + height, x + i, ACS_HLINE);
  }
}